

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

string * slang::ast::flagsToStr_abi_cxx11_(bitmask<slang::ast::MethodFlags> flags)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  bitmask<slang::ast::MethodFlags> local_36;
  bitmask<slang::ast::MethodFlags> local_34;
  bitmask<slang::ast::MethodFlags> local_32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  bitmask<slang::ast::MethodFlags> local_28;
  bitmask<slang::ast::MethodFlags> local_26;
  bitmask<slang::ast::MethodFlags> local_24;
  bitmask<slang::ast::MethodFlags> local_22;
  bitmask<slang::ast::MethodFlags> local_20;
  bitmask<slang::ast::MethodFlags> local_1e [8];
  bitmask<slang::ast::MethodFlags> local_e;
  undefined1 local_b;
  
  local_b = 0;
  this = in_RDI;
  std::__cxx11::string::string(in_stack_ffffffffffffffd0);
  bitmask<slang::ast::MethodFlags>::bitmask(&local_e,Virtual);
  bVar1 = bitmask<slang::ast::MethodFlags>::has
                    ((bitmask<slang::ast::MethodFlags> *)this,
                     (bitmask<slang::ast::MethodFlags> *)in_RDI);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
  }
  bitmask<slang::ast::MethodFlags>::bitmask(local_1e,Pure);
  bVar1 = bitmask<slang::ast::MethodFlags>::has
                    ((bitmask<slang::ast::MethodFlags> *)this,
                     (bitmask<slang::ast::MethodFlags> *)in_RDI);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
  }
  bitmask<slang::ast::MethodFlags>::bitmask(&local_20,Static);
  bVar1 = bitmask<slang::ast::MethodFlags>::has
                    ((bitmask<slang::ast::MethodFlags> *)this,
                     (bitmask<slang::ast::MethodFlags> *)in_RDI);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
  }
  bitmask<slang::ast::MethodFlags>::bitmask(&local_22,Constructor);
  bVar1 = bitmask<slang::ast::MethodFlags>::has
                    ((bitmask<slang::ast::MethodFlags> *)this,
                     (bitmask<slang::ast::MethodFlags> *)in_RDI);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
  }
  bitmask<slang::ast::MethodFlags>::bitmask(&local_24,InterfaceExtern);
  bVar1 = bitmask<slang::ast::MethodFlags>::has
                    ((bitmask<slang::ast::MethodFlags> *)this,
                     (bitmask<slang::ast::MethodFlags> *)in_RDI);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
  }
  bitmask<slang::ast::MethodFlags>::bitmask(&local_26,ModportImport);
  bVar1 = bitmask<slang::ast::MethodFlags>::has
                    ((bitmask<slang::ast::MethodFlags> *)this,
                     (bitmask<slang::ast::MethodFlags> *)in_RDI);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
  }
  bitmask<slang::ast::MethodFlags>::bitmask(&local_28,ModportExport);
  bVar1 = bitmask<slang::ast::MethodFlags>::has
                    ((bitmask<slang::ast::MethodFlags> *)this,
                     (bitmask<slang::ast::MethodFlags> *)in_RDI);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
  }
  bitmask<slang::ast::MethodFlags>::bitmask
            ((bitmask<slang::ast::MethodFlags> *)&stack0xffffffffffffffd6,DPIImport);
  bVar1 = bitmask<slang::ast::MethodFlags>::has
                    ((bitmask<slang::ast::MethodFlags> *)this,
                     (bitmask<slang::ast::MethodFlags> *)in_RDI);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
  }
  bitmask<slang::ast::MethodFlags>::bitmask
            ((bitmask<slang::ast::MethodFlags> *)&stack0xffffffffffffffd4,DPIContext);
  bVar1 = bitmask<slang::ast::MethodFlags>::has
                    ((bitmask<slang::ast::MethodFlags> *)this,
                     (bitmask<slang::ast::MethodFlags> *)in_RDI);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
  }
  bitmask<slang::ast::MethodFlags>::bitmask
            ((bitmask<slang::ast::MethodFlags> *)&stack0xffffffffffffffd2,ForkJoin);
  bVar1 = bitmask<slang::ast::MethodFlags>::has
                    ((bitmask<slang::ast::MethodFlags> *)this,
                     (bitmask<slang::ast::MethodFlags> *)in_RDI);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
  }
  bitmask<slang::ast::MethodFlags>::bitmask
            ((bitmask<slang::ast::MethodFlags> *)&stack0xffffffffffffffd0,DefaultedSuperArg);
  bVar1 = bitmask<slang::ast::MethodFlags>::has
                    ((bitmask<slang::ast::MethodFlags> *)this,
                     (bitmask<slang::ast::MethodFlags> *)in_RDI);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
  }
  bitmask<slang::ast::MethodFlags>::bitmask(&local_32,Initial);
  bVar1 = bitmask<slang::ast::MethodFlags>::has
                    ((bitmask<slang::ast::MethodFlags> *)this,
                     (bitmask<slang::ast::MethodFlags> *)in_RDI);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
  }
  bitmask<slang::ast::MethodFlags>::bitmask(&local_34,Extends);
  bVar1 = bitmask<slang::ast::MethodFlags>::has
                    ((bitmask<slang::ast::MethodFlags> *)this,
                     (bitmask<slang::ast::MethodFlags> *)in_RDI);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
  }
  bitmask<slang::ast::MethodFlags>::bitmask(&local_36,Final);
  bVar1 = bitmask<slang::ast::MethodFlags>::has
                    ((bitmask<slang::ast::MethodFlags> *)this,
                     (bitmask<slang::ast::MethodFlags> *)in_RDI);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6f8cac);
  if (!bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back(this);
  }
  return this;
}

Assistant:

static std::string flagsToStr(bitmask<MethodFlags> flags) {
    std::string str;
    if (flags.has(MethodFlags::Virtual))
        str += "virtual,";
    if (flags.has(MethodFlags::Pure))
        str += "pure,";
    if (flags.has(MethodFlags::Static))
        str += "static,";
    if (flags.has(MethodFlags::Constructor))
        str += "ctor,";
    if (flags.has(MethodFlags::InterfaceExtern))
        str += "ifaceExtern,";
    if (flags.has(MethodFlags::ModportImport))
        str += "modportImport,";
    if (flags.has(MethodFlags::ModportExport))
        str += "modportExport,";
    if (flags.has(MethodFlags::DPIImport))
        str += "dpi,";
    if (flags.has(MethodFlags::DPIContext))
        str += "context,";
    if (flags.has(MethodFlags::ForkJoin))
        str += "forkJoin,";
    if (flags.has(MethodFlags::DefaultedSuperArg))
        str += "defaultedSuperArg,";
    if (flags.has(MethodFlags::Initial))
        str += "initial,";
    if (flags.has(MethodFlags::Extends))
        str += "extends,";
    if (flags.has(MethodFlags::Final))
        str += "final,";
    if (!str.empty())
        str.pop_back();
    return str;
}